

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

void __thiscall icu_63::CollationWeights::initForSecondary(CollationWeights *this)

{
  CollationWeights *this_local;
  
  this->middleLength = 3;
  this->minBytes[1] = 0;
  this->maxBytes[1] = 0;
  this->minBytes[2] = 0;
  this->maxBytes[2] = 0;
  this->minBytes[3] = 2;
  this->maxBytes[3] = 0xff;
  this->minBytes[4] = 2;
  this->maxBytes[4] = 0xff;
  return;
}

Assistant:

void
CollationWeights::initForSecondary() {
    // We use only the lower 16 bits for secondary weights.
    middleLength=3;
    minBytes[1] = 0;
    maxBytes[1] = 0;
    minBytes[2] = 0;
    maxBytes[2] = 0;
    minBytes[3] = Collation::LEVEL_SEPARATOR_BYTE + 1;
    maxBytes[3] = 0xff;
    minBytes[4] = 2;
    maxBytes[4] = 0xff;
}